

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

void __thiscall
booster::locale::basic_message<wchar_t>::basic_message
          (basic_message<wchar_t> *this,string_type *context,string_type *id)

{
  pointer pwVar1;
  
  this->n_ = 0;
  this->c_id_ = (char_type_conflict *)0x0;
  this->c_context_ = (char_type_conflict *)0x0;
  this->c_plural_ = (char_type_conflict *)0x0;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pwVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->id_,pwVar1,pwVar1 + id->_M_string_length);
  (this->context_)._M_dataplus._M_p = (pointer)&(this->context_).field_2;
  pwVar1 = (context->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->context_,pwVar1,pwVar1 + context->_M_string_length);
  (this->plural_)._M_dataplus._M_p = (pointer)&(this->plural_).field_2;
  (this->plural_)._M_string_length = 0;
  (this->plural_).field_2._M_local_buf[0] = L'\0';
  return;
}

Assistant:

explicit basic_message(string_type const &context,string_type const &id) :
                n_(0),
                c_id_(0),
                c_context_(0),
                c_plural_(0),
                id_(id),
                context_(context)
            {
            }